

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElHDivCollapsed.cpp
# Opt level: O1

int __thiscall
TPZCompElHDivCollapsed<pzshape::TPZShapeTriang>::ConnectOrder
          (TPZCompElHDivCollapsed<pzshape::TPZShapeTriang> *this,int connect)

{
  int iVar1;
  long lVar2;
  uint uVar3;
  
  uVar3 = 0xffffffff;
  if (-1 < connect) {
    iVar1 = (**(code **)(*(long *)&(this->super_TPZCompElHDiv<pzshape::TPZShapeTriang>).
                                   super_TPZIntelGen<pzshape::TPZShapeTriang>.
                                   super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                   super_TPZCompEl + 0x90))();
    if (connect < iVar1) {
      lVar2 = (**(code **)(*(long *)&(this->super_TPZCompElHDiv<pzshape::TPZShapeTriang>).
                                     super_TPZIntelGen<pzshape::TPZShapeTriang>.
                                     super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                     super_TPZCompEl + 0xa8))(this,connect);
      uVar3 = (uint)*(byte *)(lVar2 + 0x14);
    }
  }
  return uVar3;
}

Assistant:

int TPZCompElHDivCollapsed<TSHAPE>::ConnectOrder(int connect) const {
	if (connect < 0 || connect >= NConnects()){
#ifdef PZ_LOG
		{
			std::stringstream sout;
			sout << "Connect index out of range connect " << connect <<
			" nconnects " << NConnects();
			LOGPZ_DEBUG(logger,sout.str())
		}
#endif
		return -1;
	}

    TPZConnect &c = this->Connect(connect);
    return c.Order();
}